

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

base_learner * stagewise_poly_setup(options_i *options,vw *all)

{
  pointer psVar1;
  single_learner *base;
  stagewise_poly *this;
  vw *in_RSI;
  undefined8 *in_RDI;
  learner<stagewise_poly,_example> *l;
  option_group_definition new_options;
  bool stage_poly;
  free_ptr<stagewise_poly> poly;
  string *in_stack_fffffffffffffab8;
  stagewise_poly *in_stack_fffffffffffffac0;
  string *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  byte in_stack_fffffffffffffad7;
  _func_void_stagewise_poly_ptr *f;
  undefined4 in_stack_fffffffffffffae0;
  uint32_t uVar2;
  typed_option<float> *in_stack_fffffffffffffb08;
  typed_option<bool> *op;
  option_group_definition *in_stack_fffffffffffffb10;
  option_group_definition *this_00;
  undefined1 local_459 [40];
  undefined1 local_431 [177];
  learner<char,_char> *in_stack_fffffffffffffc80;
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [199];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [199];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<bool> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  byte local_29;
  undefined1 local_28 [16];
  vw *local_18;
  undefined8 *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<stagewise_poly>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Stagewise polynomial options",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"stage_poly",&local_161);
  VW::config::make_option<bool>(in_stack_fffffffffffffac8,(bool *)in_stack_fffffffffffffac0);
  VW::config::typed_option<bool>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"use stagewise polynomial feature learning",&local_189);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffb10,(typed_option<bool> *)in_stack_fffffffffffffb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"sched_exponent",&local_251);
  std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
            ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a0d4f);
  VW::config::make_option<float>(in_stack_fffffffffffffac8,(float *)in_stack_fffffffffffffac0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
             (float)((ulong)in_stack_fffffffffffffac8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"exponent controlling quantity of included features",&local_279);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"batch_sz",&local_341);
  std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
            ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a0e3d);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffac8,(uint *)in_stack_fffffffffffffac0)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)
             CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
             (uint)((ulong)in_stack_fffffffffffffac8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_368,"multiplier on batch size before including more features",&local_369);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffffb10,(typed_option<unsigned_int> *)in_stack_fffffffffffffb08);
  this_00 = (option_group_definition *)local_431;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_431 + 1),"batch_sz_no_doubling",(allocator *)this_00);
  std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
            ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a0f0d);
  VW::config::make_option<bool>(in_stack_fffffffffffffac8,(bool *)in_stack_fffffffffffffac0);
  op = (typed_option<bool> *)local_459;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_459 + 1),"batch_sz does not double",(allocator *)op)
  ;
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>(this_00,op);
  std::__cxx11::string::~string((string *)(local_459 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_459);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffac0);
  std::__cxx11::string::~string((string *)(local_431 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_431);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffac0);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffffac0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffffac0);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (**(code **)*local_10)(local_10,local_68);
  if ((local_29 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a1424);
    psVar1->all = local_18;
    std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::get
              ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)in_stack_fffffffffffffac0);
    depthsbits_create(in_stack_fffffffffffffac0);
    f = (_func_void_stagewise_poly_ptr *)local_28;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::get
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)in_stack_fffffffffffffac0);
    sort_data_create(psVar1);
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a1464);
    in_stack_fffffffffffffad7 = ~psVar1->batch_sz_double;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a1477);
    psVar1->batch_sz_double = (bool)(in_stack_fffffffffffffad7 & 1);
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a148b);
    psVar1->sum_sparsity = 0;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a149d);
    psVar1->sum_input_sparsity = 0;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a14af);
    psVar1->num_examples = 0;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a14c1);
    psVar1->sum_sparsity_sync = 0;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a14d3);
    psVar1->sum_input_sparsity_sync = 0;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a14e5);
    psVar1->num_examples_sync = 0;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a14f7);
    psVar1->last_example_counter = 0xffffffffffffffff;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a150c);
    psVar1->numpasses = 1;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a1521);
    psVar1->update_support = false;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a1532);
    psVar1->original_ec = (example *)0x0;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a1547);
    uVar2 = psVar1->batch_sz;
    psVar1 = std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::operator->
                       ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)0x2a1558);
    psVar1->next_batch_sz = uVar2;
    setup_base((options_i *)in_stack_fffffffffffffac8,(vw *)in_stack_fffffffffffffac0);
    base = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffc80);
    this = (stagewise_poly *)
           LEARNER::init_learner<stagewise_poly,example,LEARNER::learner<char,example>>
                     ((free_ptr<stagewise_poly> *)
                      CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),base,
                      (_func_void_stagewise_poly_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffac0,
                      (_func_void_stagewise_poly_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffab8);
    in_stack_fffffffffffffac0 = this;
    LEARNER::learner<stagewise_poly,_example>::set_finish
              ((learner<stagewise_poly,_example> *)CONCAT44(uVar2,in_stack_fffffffffffffae0),f);
    LEARNER::learner<stagewise_poly,_example>::set_save_load
              ((learner<stagewise_poly,_example> *)this,save_load);
    LEARNER::learner<stagewise_poly,_example>::set_finish_example
              ((learner<stagewise_poly,_example> *)this,finish_example);
    LEARNER::learner<stagewise_poly,_example>::set_end_pass
              ((learner<stagewise_poly,_example> *)CONCAT44(uVar2,in_stack_fffffffffffffae0),f);
    local_8 = LEARNER::make_base<stagewise_poly,example>((learner<stagewise_poly,_example> *)this);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffac0);
  std::unique_ptr<stagewise_poly,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<stagewise_poly,_void_(*)(void_*)> *)
             CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
  return local_8;
}

Assistant:

base_learner *stagewise_poly_setup(options_i &options, vw &all)
{
  auto poly = scoped_calloc_or_throw<stagewise_poly>();
  bool stage_poly = false;
  option_group_definition new_options("Stagewise polynomial options");
  new_options.add(make_option("stage_poly", stage_poly).keep().help("use stagewise polynomial feature learning"))
      .add(make_option("sched_exponent", poly->sched_exponent)
               .default_value(1.f)
               .help("exponent controlling quantity of included features"))
      .add(make_option("batch_sz", poly->batch_sz)
               .default_value(1000)
               .help("multiplier on batch size before including more features"))
      .add(make_option("batch_sz_no_doubling", poly->batch_sz_double).help("batch_sz does not double"));
#ifdef MAGIC_ARGUMENT
  new_options.add(
      make_typed_option("magic_argument", poly->magic_argument).default_value(0.).help("magical feature flag"));
#endif  // MAGIC_ARGUMENT
  options.add_and_parse(new_options);

  if (!stage_poly)
    return nullptr;

  poly->all = &all;
  depthsbits_create(*poly.get());
  sort_data_create(*poly.get());

  poly->batch_sz_double = !poly->batch_sz_double;

  poly->sum_sparsity = 0;
  poly->sum_input_sparsity = 0;
  poly->num_examples = 0;
  poly->sum_sparsity_sync = 0;
  poly->sum_input_sparsity_sync = 0;
  poly->num_examples_sync = 0;
  poly->last_example_counter = -1;
  poly->numpasses = 1;
  poly->update_support = false;
  poly->original_ec = nullptr;
  poly->next_batch_sz = poly->batch_sz;

  learner<stagewise_poly, example> &l = init_learner(poly, as_singleline(setup_base(options, all)), learn, predict);
  l.set_finish(finish);
  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}